

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int properties_set_reply_to(PROPERTIES_HANDLE properties,AMQP_VALUE reply_to_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE reply_to_amqp_value;
  PROPERTIES_INSTANCE *properties_instance;
  int result;
  AMQP_VALUE reply_to_value_local;
  PROPERTIES_HANDLE properties_local;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    properties_instance._4_4_ = 0x4015;
  }
  else {
    if (reply_to_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(reply_to_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      properties_instance._4_4_ = 0x4025;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(properties->composite_value,4,local_30);
      if (iVar1 == 0) {
        properties_instance._4_4_ = 0;
      }
      else {
        properties_instance._4_4_ = 0x402b;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return properties_instance._4_4_;
}

Assistant:

int properties_set_reply_to(PROPERTIES_HANDLE properties, AMQP_VALUE reply_to_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE reply_to_amqp_value;
        if (reply_to_value == NULL)
        {
            reply_to_amqp_value = NULL;
        }
        else
        {
            reply_to_amqp_value = amqpvalue_clone(reply_to_value);
        }
        if (reply_to_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 4, reply_to_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(reply_to_amqp_value);
        }
    }

    return result;
}